

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshFace::Repair(ON_MeshFace *this,int mesh_vertex_count,ON_3dPoint *V)

{
  bool bVar1;
  uint local_3c;
  undefined1 local_38 [4];
  int fvi_count;
  ON_MeshFace f;
  ON_3dPoint *V_local;
  int mesh_vertex_count_local;
  ON_MeshFace *this_local;
  
  local_3c = 0;
  f.vi[1] = -1;
  f.vi[0] = -1;
  fvi_count = -1;
  local_38 = (undefined1  [4])0xffffffff;
  f.vi._8_8_ = V;
  if (((-1 < this->vi[0]) && (this->vi[0] < mesh_vertex_count)) &&
     (bVar1 = ON_3dPoint::IsValid(V + this->vi[0]), bVar1)) {
    local_38 = (undefined1  [4])this->vi[0];
    local_3c = 1;
  }
  if ((((-1 < this->vi[1]) && (this->vi[1] < mesh_vertex_count)) &&
      ((local_38 != (undefined1  [4])this->vi[1] &&
       (bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[1] * 0x18)), bVar1)))
      ) && ((local_3c == 0 ||
            (bVar1 = ON_3dPoint::operator!=
                               ((ON_3dPoint *)(f.vi._8_8_ + (long)(int)local_38 * 0x18),
                                (ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[1] * 0x18)), bVar1)))) {
    *(int *)(local_38 + (long)(int)local_3c * 4) = this->vi[1];
    local_3c = local_3c + 1;
  }
  if (local_3c == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (((((-1 < this->vi[2]) && (this->vi[2] < mesh_vertex_count)) &&
         (local_38 != (undefined1  [4])this->vi[2])) &&
        ((fvi_count != this->vi[2] &&
         (bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[2] * 0x18)), bVar1)
         ))) && ((bVar1 = ON_3dPoint::operator!=
                                    ((ON_3dPoint *)(f.vi._8_8_ + (long)(int)local_38 * 0x18),
                                     (ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[2] * 0x18)), bVar1
                 && ((local_3c == 1 ||
                     (bVar1 = ON_3dPoint::operator!=
                                        ((ON_3dPoint *)(f.vi._8_8_ + (long)fvi_count * 0x18),
                                         (ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[2] * 0x18)),
                     bVar1)))))) {
      *(int *)(local_38 + (long)(int)local_3c * 4) = this->vi[2];
      local_3c = local_3c + 1;
    }
    if (local_3c < 2) {
      this_local._7_1_ = false;
    }
    else {
      if (((((-1 < this->vi[3]) && (this->vi[3] < mesh_vertex_count)) &&
           (local_38 != (undefined1  [4])this->vi[3])) &&
          (((fvi_count != this->vi[3] && (f.vi[0] != this->vi[3])) &&
           ((bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[3] * 0x18)),
            bVar1 && ((bVar1 = ON_3dPoint::operator!=
                                         ((ON_3dPoint *)(f.vi._8_8_ + (long)(int)local_38 * 0x18),
                                          (ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[3] * 0x18)),
                      bVar1 && (bVar1 = ON_3dPoint::operator!=
                                                  ((ON_3dPoint *)
                                                   (f.vi._8_8_ + (long)fvi_count * 0x18),
                                                   (ON_3dPoint *)
                                                   (f.vi._8_8_ + (long)this->vi[3] * 0x18)), bVar1))
                     )))))) &&
         ((local_3c == 2 ||
          (bVar1 = ON_3dPoint::operator!=
                             ((ON_3dPoint *)(f.vi._8_8_ + (long)f.vi[0] * 0x18),
                              (ON_3dPoint *)(f.vi._8_8_ + (long)this->vi[3] * 0x18)), bVar1)))) {
        *(int *)(local_38 + (long)(int)local_3c * 4) = this->vi[3];
        local_3c = local_3c + 1;
      }
      if (local_3c < 3) {
        this_local._7_1_ = false;
      }
      else {
        if (local_3c == 3) {
          f.vi[1] = f.vi[0];
        }
        bVar1 = IsValid((ON_MeshFace *)local_38,mesh_vertex_count);
        if (bVar1) {
          this->vi[0] = (int)local_38;
          this->vi[1] = fvi_count;
          this->vi[2] = f.vi[0];
          this->vi[3] = f.vi[1];
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MeshFace::Repair(
  int mesh_vertex_count,
  const ON_3dPoint* V
  )
{
  ON_MeshFace f;
  int fvi_count = 0;
  f.vi[0] = f.vi[1] = f.vi[2] = f.vi[3] = -1;
  
  if ( vi[0] >= 0 && vi[0] < mesh_vertex_count && V[vi[0]].IsValid() )
    f.vi[fvi_count++] = vi[0];

  if (vi[1] >= 0 && vi[1] < mesh_vertex_count && f.vi[0] != vi[1] && V[vi[1]].IsValid())
  {
    if ( 0 == fvi_count || V[f.vi[0]] != V[vi[1]] )
      f.vi[fvi_count++] = vi[1];
  }

  if ( fvi_count < 1 )
    return false;

  if ( vi[2] >= 0 && vi[2] < mesh_vertex_count && f.vi[0] != vi[2] && f.vi[1] != vi[2] && V[vi[2]].IsValid() && V[f.vi[0]] != V[vi[2]] )
  {
    if ( 1 == fvi_count || V[f.vi[1]] != V[vi[2]] )
      f.vi[fvi_count++] = vi[2];
  }

  if ( fvi_count < 2 )
    return false;

  if ( vi[3] >= 0 && vi[3] < mesh_vertex_count && f.vi[0] != vi[3] && f.vi[1] != vi[3] && f.vi[2] != vi[3] && V[vi[3]].IsValid() && V[f.vi[0]] != V[vi[3]] && V[f.vi[1]] != V[vi[3]] )
  {
    if ( 2 == fvi_count || V[f.vi[2]] != V[vi[3]] )
      f.vi[fvi_count++] = vi[3];
  }
  
  if ( fvi_count < 3 )
    return false;
 
  if ( 3 == fvi_count )
    f.vi[3] = f.vi[2];
  
  if ( !f.IsValid(mesh_vertex_count) )
    return false;

  vi[0] = f.vi[0];
  vi[1] = f.vi[1];
  vi[2] = f.vi[2];
  vi[3] = f.vi[3];

  return true;
}